

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void duckdb::TemplatedWritePlain<duckdb::string_t,duckdb::string_t,duckdb::ParquetBlobOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  StringStatisticsState *string_stats;
  string_t target_value;
  undefined1 local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  anon_union_16_2_67f50693_for_value local_40;
  
  lVar3 = chunk_end - chunk_start;
  if (chunk_start <= chunk_end && lVar3 != 0) {
    p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&(col->type).id_ + chunk_start * 0x10);
    do {
      local_50 = *(undefined1 (*) [8])(p_Var1 + -1);
      local_48 = p_Var1->_M_pi;
      local_40._0_8_ = local_50;
      local_40.pointer.ptr = (char *)local_48;
      StringStatisticsState::Update((StringStatisticsState *)stats,(string_t *)&local_40.pointer);
      local_40.pointer.length = local_50._0_4_;
      (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)(mask,&local_40,4)
      ;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 4);
      if (0xc < ((ulong)local_50 & 0xffffffff)) {
        p_Var2 = local_48;
      }
      (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)(mask,p_Var2);
      p_Var1 = p_Var1 + 2;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}